

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O0

NodeRef __thiscall slang::IntervalMapDetails::Path::getLeftSibling(Path *this,uint32_t level)

{
  const_reference pEVar1;
  const_reference pEVar2;
  NodeRef *pNVar3;
  uint in_ESI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  bool bVar4;
  uint32_t l;
  NodeRef node;
  uint32_t in_stack_ffffffffffffffcc;
  uint local_18;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> local_8;
  
  local_18 = in_ESI - 1;
  while( true ) {
    bVar4 = false;
    if (local_18 != 0) {
      pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                         (in_RDI,(ulong)local_18);
      bVar4 = pEVar1->offset == 0;
    }
    if (!bVar4) break;
    local_18 = local_18 - 1;
  }
  pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                     (in_RDI,(ulong)local_18);
  if (pEVar1->offset == 0) {
    memset(&local_8,0,8);
    NodeRef::NodeRef((NodeRef *)0xeb98f4);
  }
  else {
    pEVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                       (in_RDI,(ulong)local_18);
    pEVar2 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                       (in_RDI,(ulong)local_18);
    pNVar3 = Entry::childAt(pEVar1,pEVar2->offset - 1);
    local_8.value = (pNVar3->pip).value;
    while (local_18 = local_18 + 1, local_18 != in_ESI) {
      NodeRef::size((NodeRef *)0xeb9955);
      pNVar3 = NodeRef::childAt((NodeRef *)pEVar1,in_stack_ffffffffffffffcc);
      local_8.value = (pNVar3->pip).value;
    }
  }
  return (NodeRef)(PointerIntPair<void_*,_6U,_6U,_unsigned_int>)local_8.value;
}

Assistant:

NodeRef Path::getLeftSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go left.
    uint32_t l = level - 1;
    while (l && path[l].offset == 0)
        --l;

    // If we hit the root there is no left sibling.
    if (path[l].offset == 0)
        return NodeRef();

    // Start with left subtree and go down to the right
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset - 1);
    for (++l; l != level; ++l)
        node = node.childAt(node.size() - 1);
    return node;
}